

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handshake_client.cc
# Opt level: O0

bool bssl::ssl_parse_server_hello(ParsedServerHello *out,uint8_t *out_alert,SSLMessage *msg)

{
  int iVar1;
  size_t sVar2;
  undefined1 local_38 [8];
  CBS body;
  SSLMessage *msg_local;
  uint8_t *out_alert_local;
  ParsedServerHello *out_local;
  
  body.len = (size_t)msg;
  if (msg->type != '\x02') {
    ERR_put_error(0x10,0,0xdf,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                  ,0x220);
    *out_alert = '\n';
    return false;
  }
  (out->raw).data = (msg->raw).data;
  (out->raw).len = (msg->raw).len;
  local_38 = (undefined1  [8])(msg->body).data;
  body.data = (uint8_t *)(msg->body).len;
  iVar1 = CBS_get_u16((CBS *)local_38,&out->legacy_version);
  if (((((iVar1 != 0) && (iVar1 = CBS_get_bytes((CBS *)local_38,&out->random,0x20), iVar1 != 0)) &&
       (iVar1 = CBS_get_u8_length_prefixed((CBS *)local_38,&out->session_id), iVar1 != 0)) &&
      ((sVar2 = CBS_len(&out->session_id), sVar2 < 0x21 &&
       (iVar1 = CBS_get_u16((CBS *)local_38,&out->cipher_suite), iVar1 != 0)))) &&
     (iVar1 = CBS_get_u8((CBS *)local_38,&out->compression_method), iVar1 != 0)) {
    CBS_init(&out->extensions,(uint8_t *)0x0,0);
    sVar2 = CBS_len((CBS *)local_38);
    if (((sVar2 == 0) ||
        (iVar1 = CBS_get_u16_length_prefixed((CBS *)local_38,&out->extensions), iVar1 != 0)) &&
       (sVar2 = CBS_len((CBS *)local_38), sVar2 == 0)) {
      return true;
    }
    ERR_put_error(0x10,0,0x89,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                  ,0x236);
    *out_alert = '2';
    return false;
  }
  ERR_put_error(0x10,0,0x89,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                ,0x22c);
  *out_alert = '2';
  return false;
}

Assistant:

bool ssl_parse_server_hello(ParsedServerHello *out, uint8_t *out_alert,
                            const SSLMessage &msg) {
  if (msg.type != SSL3_MT_SERVER_HELLO) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_UNEXPECTED_MESSAGE);
    *out_alert = SSL_AD_UNEXPECTED_MESSAGE;
    return false;
  }
  out->raw = msg.raw;
  CBS body = msg.body;
  if (!CBS_get_u16(&body, &out->legacy_version) ||
      !CBS_get_bytes(&body, &out->random, SSL3_RANDOM_SIZE) ||
      !CBS_get_u8_length_prefixed(&body, &out->session_id) ||
      CBS_len(&out->session_id) > SSL3_SESSION_ID_SIZE ||
      !CBS_get_u16(&body, &out->cipher_suite) ||
      !CBS_get_u8(&body, &out->compression_method)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
    *out_alert = SSL_AD_DECODE_ERROR;
    return false;
  }
  // In TLS 1.2 and below, empty extensions blocks may be omitted. In TLS 1.3,
  // ServerHellos always have extensions, so this can be applied generically.
  CBS_init(&out->extensions, nullptr, 0);
  if ((CBS_len(&body) != 0 &&
       !CBS_get_u16_length_prefixed(&body, &out->extensions)) ||
      CBS_len(&body) != 0) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
    *out_alert = SSL_AD_DECODE_ERROR;
    return false;
  }
  return true;
}